

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ly_err_free(void *ptr)

{
  ly_err_item *plVar1;
  ly_err_item *next;
  ly_err_item *i;
  void *ptr_local;
  
  next = (ly_err_item *)ptr;
  while (next != (ly_err_item *)0x0) {
    plVar1 = next->next;
    free(next->msg);
    free(next->path);
    free(next->apptag);
    free(next);
    next = plVar1;
  }
  return;
}

Assistant:

void
ly_err_free(void *ptr)
{
    struct ly_err_item *i, *next;

    /* clean the error list */
    for (i = (struct ly_err_item *)ptr; i; i = next) {
        next = i->next;
        free(i->msg);
        free(i->path);
        free(i->apptag);
        free(i);
    }
}